

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::recreateLayout(QWizardPrivate *this,QWizardLayoutInfo *info)

{
  WizardStyle WVar1;
  long lVar2;
  QGridLayout *this_00;
  QWizardRuler *pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Spec SVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint column;
  int iVar15;
  long *plVar16;
  long lVar17;
  QObject *pQVar18;
  QWizardHeader *pQVar19;
  QWidget *pQVar20;
  QPalette *pQVar21;
  QLabel *pQVar22;
  QSpacerItem *this_01;
  QWatermarkLabel *pQVar23;
  int rightMargin;
  uint right;
  Weight WVar24;
  QLayout *this_02;
  int iVar25;
  undefined1 uVar26;
  byte bVar27;
  int topMargin;
  int iVar28;
  uint top;
  uint w;
  long in_FS_OFFSET;
  bool bVar29;
  QLatin1StringView latin1;
  int local_a8;
  QArrayDataPointer<char16_t> local_78;
  QColor local_58;
  Spec local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  iVar11 = (**(code **)(*(long *)&this->mainLayout->super_QLayout + 200))();
  while (this_00 = this->mainLayout, 0 < iVar11) {
    iVar11 = iVar11 + -1;
    plVar16 = (long *)(**(code **)(*(long *)&this_00->super_QLayout + 0xb0))(this_00,iVar11);
    lVar17 = (**(code **)(*plVar16 + 0x70))(plVar16);
    if (lVar17 == 0) {
      (**(code **)(*plVar16 + 8))(plVar16);
    }
    else {
      pQVar18 = (QObject *)(**(code **)(*plVar16 + 0x70))();
      QObject::setParent(pQVar18);
    }
  }
  iVar11 = QGridLayout::columnCount(this_00);
  while (0 < iVar11) {
    iVar11 = iVar11 + -1;
    QGridLayout::setColumnMinimumWidth(this->mainLayout,iVar11,0);
  }
  iVar11 = QGridLayout::rowCount(this->mainLayout);
  while (0 < iVar11) {
    iVar11 = iVar11 + -1;
    QGridLayout::setRowMinimumHeight(this->mainLayout,iVar11,0);
  }
  WVar1 = info->wizStyle;
  iVar12 = info->topLevelMarginLeft - info->childMarginLeft;
  iVar11 = info->topLevelMarginBottom;
  uVar13 = iVar11 - info->childMarginBottom;
  iVar14 = iVar11 - info->vspacing;
  if (WVar1 == MacStyle) {
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    QLayout::setContentsMargins(&this->mainLayout->super_QLayout,(QMargins *)&local_78);
    (**(code **)(*(long *)&this->mainLayout->super_QLayout + 0x68))(this->mainLayout,0);
    QLayout::setContentsMargins((QLayout *)this->buttonLayout,0x14,0xd,0x14,0x11);
    QLayout::setContentsMargins((QLayout *)this->pageVBoxLayout,7,7,7,7);
    local_a8 = 3;
    column = 1;
  }
  else {
    iVar15 = info->topLevelMarginRight;
    iVar28 = info->topLevelMarginTop;
    column = (byte)(info->sideWidget | info->watermark) & 1;
    local_a8 = column + 1;
    if (WVar1 == ModernStyle) {
      iVar11 = info->childMarginRight;
      iVar25 = info->childMarginTop;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      QLayout::setContentsMargins(&this->mainLayout->super_QLayout,(QMargins *)&local_78);
      (**(code **)(*(long *)&this->mainLayout->super_QLayout + 0x68))(this->mainLayout,0);
      QLayout::setContentsMargins
                ((QLayout *)this->pageVBoxLayout,iVar12,iVar28 - iVar25,iVar15 - iVar11,uVar13);
      this_02 = (QLayout *)this->buttonLayout;
      iVar11 = info->topLevelMarginTop;
      iVar15 = info->topLevelMarginLeft;
      iVar28 = info->topLevelMarginRight;
      iVar25 = info->topLevelMarginBottom;
    }
    else {
      QLayout::setContentsMargins
                (&this->mainLayout->super_QLayout,info->topLevelMarginLeft,iVar28,iVar15,iVar11);
      QGridLayout::setHorizontalSpacing(this->mainLayout,info->hspacing);
      QGridLayout::setVerticalSpacing(this->mainLayout,info->vspacing);
      QLayout::setContentsMargins((QLayout *)this->pageVBoxLayout,0,0,0,0);
      this_02 = (QLayout *)this->buttonLayout;
      iVar15 = 0;
      iVar11 = 0;
      iVar28 = 0;
      iVar25 = 0;
    }
    QLayout::setContentsMargins(this_02,iVar15,iVar11,iVar28,iVar25);
  }
  (**(code **)(*(long *)&(this->buttonLayout->super_QBoxLayout).super_QLayout + 0x68))();
  iVar11 = 0;
  if (info->header == true) {
    pQVar19 = this->headerWidget;
    if (pQVar19 == (QWizardHeader *)0x0) {
      pQVar19 = (QWizardHeader *)operator_new(0x60);
      QWizardHeader::QWizardHeader(pQVar19,&this->antiFlickerWidget->super_QWidget);
      this->headerWidget = pQVar19;
    }
    QWidget::setAutoFillBackground(&pQVar19->super_QWidget,WVar1 == ModernStyle);
    QGridLayout::addWidget
              (this->mainLayout,&this->headerWidget->super_QWidget,0,0,1,local_a8,(Alignment)0x0);
    iVar11 = 1;
  }
  if (this->headerWidget != (QWizardHeader *)0x0) {
    (**(code **)(*(long *)&this->headerWidget->super_QWidget + 0x68))();
  }
  iVar15 = iVar11;
  if (WVar1 == MacStyle) {
    iVar15 = iVar11 + 1;
    QGridLayout::setRowMinimumHeight(this->mainLayout,iVar11,10);
  }
  if (info->title == true) {
    if (this->titleLabel == (QLabel *)0x0) {
      pQVar20 = (QWidget *)operator_new(0x28);
      QLabel::QLabel((QLabel *)pQVar20,&this->antiFlickerWidget->super_QWidget,(WindowFlags)0x0);
      this->titleLabel = (QLabel *)pQVar20;
      QWidget::setBackgroundRole(pQVar20,Base);
      QLabel::setWordWrap(this->titleLabel,true);
    }
    local_48 = 0xaaaaaaaa;
    uStack_44 = 0xaaaaaaaa;
    uStack_40 = 0xaaaaaaaa;
    uStack_3c = 0xaaaa;
    uStack_3a = 0xaaaa;
    QFont::QFont((QFont *)&local_48,(QFont *)(*(long *)(lVar2 + 0x20) + 0x38));
    QFont::pointSize();
    WVar24 = (Weight)(QFont *)&local_48;
    QFont::setPointSize(WVar24);
    QFont::setWeight(WVar24);
    pQVar20 = (QWidget *)this->titleLabel;
    QPalette::QPalette((QPalette *)&local_78);
    QWidget::setPalette(pQVar20,(QPalette *)&local_78);
    QPalette::~QPalette((QPalette *)&local_78);
    if (WVar1 == AeroStyle) {
      latin1.m_data = "Segoe UI";
      latin1.m_size = 8;
      QString::QString((QString *)&local_78,latin1);
      QFont::QFont((QFont *)&local_58,(QString *)&local_78,0xc,-1,false);
      uVar10 = uStack_40;
      uVar9 = uStack_44;
      SVar8 = local_48;
      local_48 = local_58.cspec;
      uStack_44 = local_58.ct._0_4_;
      local_58.cspec = SVar8;
      local_58.ct._0_4_ = uVar9;
      uStack_40 = local_58.ct._4_4_;
      local_58.ct._4_4_ = uVar10;
      QFont::~QFont((QFont *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar21 = QWidget::palette((QWidget *)this->titleLabel);
      QPalette::QPalette((QPalette *)&local_78,pQVar21);
      local_58.cspec = Rgb;
      local_58.ct._0_4_ = 0xffff;
      local_58.ct._4_4_ = 0x99993333;
      local_58.ct.argb.pad = 0;
      QPalette::setColor((QPalette *)&local_78,Text,&local_58);
      QWidget::setPalette((QWidget *)this->titleLabel,(QPalette *)&local_78);
      QPalette::~QPalette((QPalette *)&local_78);
      QWidget::setFont((QWidget *)this->titleLabel,(QFont *)&local_48);
      QLabel::setIndent(this->titleLabel,0x19);
    }
    else {
      QWidget::setFont((QWidget *)this->titleLabel,(QFont *)&local_48);
      pQVar22 = this->titleLabel;
      if (WVar1 == MacStyle) {
        QLabel::setIndent(pQVar22,2);
      }
      else if (WVar1 == ClassicStyle) {
        QLabel::setIndent(pQVar22,info->childMarginLeft);
      }
      else {
        QLabel::setIndent(pQVar22,info->topLevelMarginLeft);
        if (WVar1 == ModernStyle) {
          pQVar20 = this->placeholderWidget1;
          if (pQVar20 == (QWidget *)0x0) {
            pQVar20 = (QWidget *)operator_new(0x28);
            QWidget::QWidget(pQVar20,&this->antiFlickerWidget->super_QWidget,(WindowFlags)0x0);
            this->placeholderWidget1 = pQVar20;
            QWidget::setBackgroundRole(pQVar20,Base);
            pQVar20 = this->placeholderWidget1;
          }
          QWidget::setFixedHeight(pQVar20,info->topLevelMarginLeft + 2);
          QGridLayout::addWidget
                    (this->mainLayout,this->placeholderWidget1,iVar15,column,(Alignment)0x0);
          iVar15 = iVar15 + 1;
        }
      }
    }
    iVar28 = iVar15 + 1;
    QGridLayout::addWidget
              (this->mainLayout,(QWidget *)this->titleLabel,iVar15,column,(Alignment)0x0);
    if (WVar1 == ModernStyle) {
      pQVar20 = this->placeholderWidget2;
      if (pQVar20 == (QWidget *)0x0) {
        pQVar20 = (QWidget *)operator_new(0x28);
        QWidget::QWidget(pQVar20,&this->antiFlickerWidget->super_QWidget,(WindowFlags)0x0);
        this->placeholderWidget2 = pQVar20;
        QWidget::setBackgroundRole(pQVar20,Base);
        pQVar20 = this->placeholderWidget2;
      }
      QWidget::setFixedHeight(pQVar20,5);
      QGridLayout::addWidget(this->mainLayout,this->placeholderWidget2,iVar28,column,(Alignment)0x0)
      ;
LAB_004c2af6:
      iVar28 = iVar15 + 2;
    }
    else if (WVar1 == MacStyle) {
      QGridLayout::setRowMinimumHeight(this->mainLayout,iVar28,7);
      goto LAB_004c2af6;
    }
    iVar15 = iVar28;
    QFont::~QFont((QFont *)&local_48);
  }
  if (this->placeholderWidget1 != (QWidget *)0x0) {
    (**(code **)(*(long *)this->placeholderWidget1 + 0x68))();
  }
  if (this->placeholderWidget2 != (QWidget *)0x0) {
    (**(code **)(*(long *)this->placeholderWidget2 + 0x68))();
  }
  bVar27 = info->subTitle;
  if (((bool)bVar27 == true) && (this->subTitleLabel == (QLabel *)0x0)) {
    pQVar22 = (QLabel *)operator_new(0x28);
    QLabel::QLabel(pQVar22,&this->pageFrame->super_QWidget,(WindowFlags)0x0);
    this->subTitleLabel = pQVar22;
    QLabel::setWordWrap(pQVar22,true);
    QWidget::setContentsMargins
              ((QWidget *)this->subTitleLabel,info->childMarginLeft,0,info->childMarginRight,0);
    QBoxLayout::insertWidget
              (&this->pageVBoxLayout->super_QBoxLayout,1,(QWidget *)this->subTitleLabel,0,
               (Alignment)0x0);
    bVar27 = info->subTitle;
  }
  iVar28 = info->childMarginLeft;
  plVar16 = (long *)(**(code **)(*(long *)&(this->pageVBoxLayout->super_QBoxLayout).super_QLayout +
                                0xa8))();
  this_01 = (QSpacerItem *)(**(code **)(*plVar16 + 0x78))(plVar16);
  if (this_01 != (QSpacerItem *)0x0) {
    if ((bVar27 & 1) == 0) {
      iVar28 = 0;
    }
    QSpacerItem::changeSize(this_01,0,iVar28,Minimum,Minimum);
  }
  bVar29 = WVar1 == MacStyle;
  top = (uint)bVar29;
  iVar28 = 0x21;
  if (!bVar29) {
    iVar28 = 0;
  }
  QFrame::setFrameStyle(this->pageFrame,iVar28);
  QFrame::setLineWidth(this->pageFrame,0);
  w = (uint)bVar29;
  QFrame::setMidLineWidth(this->pageFrame,w);
  right = (uint)bVar29;
  if (info->header == true) {
    if (WVar1 != ModernStyle) {
      right = iVar12 + 4;
      if (WVar1 != ClassicStyle) {
        right = (uint)bVar29;
      }
      goto LAB_004c2c72;
    }
    right = info->topLevelMarginLeft;
    w = uVar13;
LAB_004c2c8d:
    pQVar20 = &this->pageFrame->super_QWidget;
    uVar13 = right;
    top = w;
  }
  else {
LAB_004c2c72:
    if (WVar1 != AeroStyle) goto LAB_004c2c8d;
    pQVar20 = &this->pageFrame->super_QWidget;
    uVar13 = 0x12;
  }
  QWidget::setContentsMargins(pQVar20,uVar13,top,right,top);
  if (((info->watermark != false) || (info->sideWidget == true)) &&
     (this->watermarkLabel == (QWatermarkLabel *)0x0)) {
    pQVar23 = (QWatermarkLabel *)operator_new(0x38);
    QWatermarkLabel::QWatermarkLabel
              (pQVar23,&this->antiFlickerWidget->super_QWidget,this->sideWidget);
    this->watermarkLabel = pQVar23;
    QWidget::setBackgroundRole((QWidget *)pQVar23,Base);
    QWidget::setMinimumHeight((QWidget *)this->watermarkLabel,1);
    QWidget::setSizePolicy((QWidget *)this->watermarkLabel,(QSizePolicy)0x700000);
    QLabel::setAlignment(&this->watermarkLabel->super_QLabel,(Alignment)0x21);
  }
  pQVar21 = QWidget::palette(&this->pageFrame->super_QWidget);
  QPalette::brush(pQVar21,Window);
  iVar12 = QColor::alpha();
  if (iVar12 < 0xff) {
    if (WVar1 == MacStyle) goto LAB_004c2d77;
LAB_004c2da0:
    pQVar20 = &this->pageFrame->super_QWidget;
    QPalette::QPalette((QPalette *)&local_78);
    QWidget::setPalette(pQVar20,(QPalette *)&local_78);
    QPalette::~QPalette((QPalette *)&local_78);
LAB_004c2dcc:
    bVar29 = (bool)((info->header ^ 1U) & WVar1 == ModernStyle);
    QWidget::setBackgroundRole(&this->pageFrame->super_QWidget,Window - bVar29);
    if ((QWidget *)this->titleLabel != (QWidget *)0x0) {
      QWidget::setAutoFillBackground((QWidget *)this->titleLabel,bVar29);
    }
    QWidget::setAutoFillBackground(&this->pageFrame->super_QWidget,bVar29);
    if (this->watermarkLabel != (QWatermarkLabel *)0x0) {
      QWidget::setAutoFillBackground((QWidget *)this->watermarkLabel,bVar29);
    }
    if (this->placeholderWidget1 != (QWidget *)0x0) {
      QWidget::setAutoFillBackground(this->placeholderWidget1,bVar29);
    }
    if (this->placeholderWidget2 != (QWidget *)0x0) {
      QWidget::setAutoFillBackground(this->placeholderWidget2,bVar29);
    }
    if (WVar1 == AeroStyle) {
      local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar21 = QWidget::palette(&this->pageFrame->super_QWidget);
      QPalette::QPalette((QPalette *)&local_78,pQVar21);
      uStack_44 = 0xffffffff;
      uStack_40 = 0xffffffff;
      uStack_3c = 0;
      local_48 = Rgb;
      QBrush::QBrush((QBrush *)&local_58,(QColor *)&local_48,SolidPattern);
      QPalette::setBrush((QPalette *)&local_78,Window,(QBrush *)&local_58);
      QBrush::~QBrush((QBrush *)&local_58);
      QWidget::setPalette(&this->pageFrame->super_QWidget,(QPalette *)&local_78);
      QWidget::setAutoFillBackground(&this->pageFrame->super_QWidget,true);
      pQVar21 = QWidget::palette(&this->antiFlickerWidget->super_QWidget);
      QPalette::operator=((QPalette *)&local_78,pQVar21);
      uStack_44 = 0xffffffff;
      uStack_40 = 0xffffffff;
      uStack_3c = 0;
      local_48 = Rgb;
      QBrush::QBrush((QBrush *)&local_58,(QColor *)&local_48,SolidPattern);
      QPalette::setBrush((QPalette *)&local_78,Window,(QBrush *)&local_58);
      QBrush::~QBrush((QBrush *)&local_58);
      QWidget::setPalette(&this->antiFlickerWidget->super_QWidget,(QPalette *)&local_78);
      QWidget::setAutoFillBackground(&this->antiFlickerWidget->super_QWidget,true);
      QPalette::~QPalette((QPalette *)&local_78);
    }
  }
  else {
    pQVar21 = QWidget::palette(&this->pageFrame->super_QWidget);
    QPalette::brush(pQVar21,Base);
    iVar12 = QColor::alpha();
    if (WVar1 != MacStyle) {
      if (iVar12 < 0xff) goto LAB_004c2da0;
      goto LAB_004c2dcc;
    }
LAB_004c2d77:
    QWidget::setAutoFillBackground(&this->pageFrame->super_QWidget,true);
    QWidget::setAutoFillBackground(&this->antiFlickerWidget->super_QWidget,false);
  }
  iVar12 = iVar15 + 1;
  QGridLayout::addWidget
            (this->mainLayout,&this->pageFrame->super_QWidget,iVar15,column,(Alignment)0x0);
  if (WVar1 == ClassicStyle) {
    QGridLayout::setRowMinimumHeight(this->mainLayout,iVar12,iVar14);
    uVar13 = (uint)info->extension;
    iVar28 = iVar15 + 2;
    if (info->extension != false) {
      local_a8 = 1;
    }
LAB_004c3023:
    pQVar20 = (QWidget *)this->bottomRuler;
    if (pQVar20 == (QWidget *)0x0) {
      pQVar20 = (QWidget *)operator_new(0x60);
      QWizardRuler::QWizardRuler((QWizardRuler *)pQVar20,&this->antiFlickerWidget->super_QWidget);
      this->bottomRuler = (QWizardRuler *)pQVar20;
    }
    QGridLayout::addWidget(this->mainLayout,pQVar20,iVar28,uVar13,1,local_a8,(Alignment)0x0);
    iVar15 = iVar28 + 1;
    if (WVar1 == ClassicStyle) {
      iVar15 = iVar28 + 2;
      QGridLayout::setRowMinimumHeight(this->mainLayout,iVar28 + 1,iVar14);
    }
    uVar26 = 1;
  }
  else {
    if (WVar1 == AeroStyle) {
      QLayout::setContentsMargins((QLayout *)this->buttonLayout,9,9,9,9);
      QLayout::setContentsMargins(&this->mainLayout->super_QLayout,0,0xb,0,0);
      uVar13 = (uint)info->extension;
      if (info->extension != false) {
        local_a8 = 1;
      }
    }
    else {
      uVar13 = (uint)info->extension;
      if (info->extension != false) {
        local_a8 = 1;
      }
      iVar28 = iVar12;
      if (WVar1 == ModernStyle) goto LAB_004c3023;
    }
    uVar26 = 0;
    iVar15 = iVar12;
  }
  QGridLayout::addLayout
            (this->mainLayout,(QLayout *)this->buttonLayout,iVar15,uVar13,1,local_a8,(Alignment)0x0)
  ;
  if ((info->watermark != false) || (iVar14 = 0xb5, info->sideWidget == true)) {
    if (info->extension != false) {
      iVar12 = iVar15 + 1;
    }
    QGridLayout::addWidget
              (this->mainLayout,(QWidget *)this->watermarkLabel,iVar11,0,iVar12 - iVar11,1,
               (Alignment)0x0);
    iVar14 = 0xb5;
    if ((info->watermark & 1U) != 0) {
      iVar14 = 0;
    }
  }
  if (WVar1 != MacStyle) {
    iVar14 = 0;
  }
  QGridLayout::setColumnMinimumWidth(this->mainLayout,0,iVar14);
  if (WVar1 == MacStyle) {
    QGridLayout::setColumnMinimumWidth(this->mainLayout,2,0x15);
  }
  pQVar19 = this->headerWidget;
  if (pQVar19 != (QWizardHeader *)0x0) {
    (**(code **)(*(long *)&pQVar19->super_QWidget + 0x68))(pQVar19,info->header);
  }
  pQVar22 = this->titleLabel;
  if (pQVar22 != (QLabel *)0x0) {
    (**(code **)(*(long *)&(pQVar22->super_QFrame).super_QWidget + 0x68))(pQVar22,info->title);
  }
  pQVar22 = this->subTitleLabel;
  if (pQVar22 != (QLabel *)0x0) {
    (**(code **)(*(long *)&(pQVar22->super_QFrame).super_QWidget + 0x68))(pQVar22,info->subTitle);
  }
  pQVar3 = this->bottomRuler;
  if (pQVar3 != (QWizardRuler *)0x0) {
    (**(code **)(*(long *)&(pQVar3->super_QWizardHeader).super_QWidget + 0x68))(pQVar3,uVar26);
  }
  pQVar23 = this->watermarkLabel;
  if (pQVar23 != (QWatermarkLabel *)0x0) {
    (**(code **)(*(long *)&(pQVar23->super_QLabel).super_QFrame.super_QWidget + 0x68))
              (pQVar23,(info->sideWidget | info->watermark) & 1);
  }
  *(undefined8 *)((long)&(this->layoutInfo).wizStyle + 2) =
       *(undefined8 *)((long)&info->wizStyle + 2);
  iVar11 = info->topLevelMarginLeft;
  iVar12 = info->topLevelMarginRight;
  iVar14 = info->topLevelMarginTop;
  iVar15 = info->topLevelMarginBottom;
  iVar28 = info->childMarginLeft;
  iVar25 = info->childMarginRight;
  iVar4 = info->childMarginTop;
  iVar5 = info->childMarginBottom;
  iVar6 = info->vspacing;
  iVar7 = info->buttonSpacing;
  WVar1 = info->wizStyle;
  (this->layoutInfo).hspacing = info->hspacing;
  (this->layoutInfo).vspacing = iVar6;
  (this->layoutInfo).buttonSpacing = iVar7;
  (this->layoutInfo).wizStyle = WVar1;
  (this->layoutInfo).childMarginLeft = iVar28;
  (this->layoutInfo).childMarginRight = iVar25;
  (this->layoutInfo).childMarginTop = iVar4;
  (this->layoutInfo).childMarginBottom = iVar5;
  (this->layoutInfo).topLevelMarginLeft = iVar11;
  (this->layoutInfo).topLevelMarginRight = iVar12;
  (this->layoutInfo).topLevelMarginTop = iVar14;
  (this->layoutInfo).topLevelMarginBottom = iVar15;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardPrivate::recreateLayout(const QWizardLayoutInfo &info)
{
    Q_Q(QWizard);

    /*
        Start by undoing the main layout.
    */
    for (int i = mainLayout->count() - 1; i >= 0; --i) {
        QLayoutItem *item = mainLayout->takeAt(i);
        if (item->layout()) {
            item->layout()->setParent(nullptr);
        } else {
            delete item;
        }
    }
    for (int i = mainLayout->columnCount() - 1; i >= 0; --i)
        mainLayout->setColumnMinimumWidth(i, 0);
    for (int i = mainLayout->rowCount() - 1; i >= 0; --i)
        mainLayout->setRowMinimumHeight(i, 0);

    /*
        Now, recreate it.
    */

    bool mac = (info.wizStyle == QWizard::MacStyle);
    bool classic = (info.wizStyle == QWizard::ClassicStyle);
    bool modern = (info.wizStyle == QWizard::ModernStyle);
    bool aero = (info.wizStyle == QWizard::AeroStyle);
    int deltaMarginLeft = info.topLevelMarginLeft - info.childMarginLeft;
    int deltaMarginRight = info.topLevelMarginRight - info.childMarginRight;
    int deltaMarginTop = info.topLevelMarginTop - info.childMarginTop;
    int deltaMarginBottom = info.topLevelMarginBottom - info.childMarginBottom;
    int deltaVSpacing = info.topLevelMarginBottom - info.vspacing;

    int row = 0;
    int numColumns;
    if (mac) {
        numColumns = 3;
    } else if (info.watermark || info.sideWidget) {
        numColumns = 2;
    } else {
        numColumns = 1;
    }
    int pageColumn = qMin(1, numColumns - 1);

    if (mac) {
        mainLayout->setContentsMargins(QMargins());
        mainLayout->setSpacing(0);
        buttonLayout->setContentsMargins(MacLayoutLeftMargin, MacButtonTopMargin, MacLayoutRightMargin, MacLayoutBottomMargin);
        pageVBoxLayout->setContentsMargins(7, 7, 7, 7);
    } else {
        if (modern) {
            mainLayout->setContentsMargins(QMargins());
            mainLayout->setSpacing(0);
            pageVBoxLayout->setContentsMargins(deltaMarginLeft, deltaMarginTop,
                                               deltaMarginRight, deltaMarginBottom);
            buttonLayout->setContentsMargins(info.topLevelMarginLeft, info.topLevelMarginTop,
                                             info.topLevelMarginRight, info.topLevelMarginBottom);
        } else {
            mainLayout->setContentsMargins(info.topLevelMarginLeft, info.topLevelMarginTop,
                                           info.topLevelMarginRight, info.topLevelMarginBottom);
            mainLayout->setHorizontalSpacing(info.hspacing);
            mainLayout->setVerticalSpacing(info.vspacing);
            pageVBoxLayout->setContentsMargins(0, 0, 0, 0);
            buttonLayout->setContentsMargins(0, 0, 0, 0);
        }
    }
    buttonLayout->setSpacing(info.buttonSpacing);

    if (info.header) {
        if (!headerWidget)
            headerWidget = new QWizardHeader(antiFlickerWidget);
        headerWidget->setAutoFillBackground(modern);
        mainLayout->addWidget(headerWidget, row++, 0, 1, numColumns);
    }
    if (headerWidget)
        headerWidget->setVisible(info.header);

    int watermarkStartRow = row;

    if (mac)
        mainLayout->setRowMinimumHeight(row++, 10);

    if (info.title) {
        if (!titleLabel) {
            titleLabel = new QLabel(antiFlickerWidget);
            titleLabel->setBackgroundRole(QPalette::Base);
            titleLabel->setWordWrap(true);
        }

        QFont titleFont = q->font();
        titleFont.setPointSize(titleFont.pointSize() + (mac ? 3 : 4));
        titleFont.setBold(true);
        titleLabel->setPalette(QPalette());

        if (aero) {
            // ### hardcoded for now:
            titleFont = QFont("Segoe UI"_L1, 12);
            QPalette pal(titleLabel->palette());
            pal.setColor(QPalette::Text, QColor(0x00, 0x33, 0x99));
            titleLabel->setPalette(pal);
        }

        titleLabel->setFont(titleFont);
        const int aeroTitleIndent = 25; // ### hardcoded for now - should be calculated somehow
        if (aero)
            titleLabel->setIndent(aeroTitleIndent);
        else if (mac)
            titleLabel->setIndent(2);
        else if (classic)
            titleLabel->setIndent(info.childMarginLeft);
        else
            titleLabel->setIndent(info.topLevelMarginLeft);
        if (modern) {
            if (!placeholderWidget1) {
                placeholderWidget1 = new QWidget(antiFlickerWidget);
                placeholderWidget1->setBackgroundRole(QPalette::Base);
            }
            placeholderWidget1->setFixedHeight(info.topLevelMarginLeft + 2);
            mainLayout->addWidget(placeholderWidget1, row++, pageColumn);
        }
        mainLayout->addWidget(titleLabel, row++, pageColumn);
        if (modern) {
            if (!placeholderWidget2) {
                placeholderWidget2 = new QWidget(antiFlickerWidget);
                placeholderWidget2->setBackgroundRole(QPalette::Base);
            }
            placeholderWidget2->setFixedHeight(5);
            mainLayout->addWidget(placeholderWidget2, row++, pageColumn);
        }
        if (mac)
            mainLayout->setRowMinimumHeight(row++, 7);
    }
    if (placeholderWidget1)
        placeholderWidget1->setVisible(info.title && modern);
    if (placeholderWidget2)
        placeholderWidget2->setVisible(info.title && modern);

    if (info.subTitle) {
        if (!subTitleLabel) {
            subTitleLabel = new QLabel(pageFrame);
            subTitleLabel->setWordWrap(true);

            subTitleLabel->setContentsMargins(info.childMarginLeft , 0,
                                              info.childMarginRight , 0);

            pageVBoxLayout->insertWidget(1, subTitleLabel);
        }
    }

    // ### try to replace with margin.
    changeSpacerSize(pageVBoxLayout, 0, 0, info.subTitle ? info.childMarginLeft : 0);

    int hMargin = mac ? 1 : 0;
    int vMargin = hMargin;

    pageFrame->setFrameStyle(mac ? (QFrame::Box | QFrame::Raised) : QFrame::NoFrame);
    pageFrame->setLineWidth(0);
    pageFrame->setMidLineWidth(hMargin);

    if (info.header) {
        if (modern) {
            hMargin = info.topLevelMarginLeft;
            vMargin = deltaMarginBottom;
        } else if (classic) {
            hMargin = deltaMarginLeft + ClassicHMargin;
            vMargin = 0;
        }
    }

    if (aero) {
        int leftMargin   = 18; // ### hardcoded for now - should be calculated somehow
        int topMargin    = vMargin;
        int rightMargin  = hMargin; // ### for now
        int bottomMargin = vMargin;
        pageFrame->setContentsMargins(leftMargin, topMargin, rightMargin, bottomMargin);
    } else {
        pageFrame->setContentsMargins(hMargin, vMargin, hMargin, vMargin);
    }

    if ((info.watermark || info.sideWidget) && !watermarkLabel) {
        watermarkLabel = new QWatermarkLabel(antiFlickerWidget, sideWidget);
        watermarkLabel->setBackgroundRole(QPalette::Base);
        watermarkLabel->setMinimumHeight(1);
        watermarkLabel->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Expanding);
        watermarkLabel->setAlignment(Qt::AlignLeft | Qt::AlignTop);
    }

    //bool wasSemiTransparent = pageFrame->testAttribute(Qt::WA_SetPalette);
    const bool wasSemiTransparent =
        pageFrame->palette().brush(QPalette::Window).color().alpha() < 255
        || pageFrame->palette().brush(QPalette::Base).color().alpha() < 255;
    if (mac) {
        pageFrame->setAutoFillBackground(true);
        antiFlickerWidget->setAutoFillBackground(false);
    } else {
        if (wasSemiTransparent)
            pageFrame->setPalette(QPalette());

        bool baseBackground = (modern && !info.header); // ### TAG1
        pageFrame->setBackgroundRole(baseBackground ? QPalette::Base : QPalette::Window);

        if (titleLabel)
            titleLabel->setAutoFillBackground(baseBackground);
        pageFrame->setAutoFillBackground(baseBackground);
        if (watermarkLabel)
            watermarkLabel->setAutoFillBackground(baseBackground);
        if (placeholderWidget1)
            placeholderWidget1->setAutoFillBackground(baseBackground);
        if (placeholderWidget2)
            placeholderWidget2->setAutoFillBackground(baseBackground);

        if (aero) {
            QPalette pal = pageFrame->palette();
            pal.setBrush(QPalette::Window, QColor(255, 255, 255));
            pageFrame->setPalette(pal);
            pageFrame->setAutoFillBackground(true);
            pal = antiFlickerWidget->palette();
            pal.setBrush(QPalette::Window, QColor(255, 255, 255));
            antiFlickerWidget->setPalette(pal);
            antiFlickerWidget->setAutoFillBackground(true);
        }
    }

    mainLayout->addWidget(pageFrame, row++, pageColumn);

    int watermarkEndRow = row;
    if (classic)
        mainLayout->setRowMinimumHeight(row++, deltaVSpacing);

    if (aero) {
        buttonLayout->setContentsMargins(9, 9, 9, 9);
        mainLayout->setContentsMargins(0, 11, 0, 0);
    }

    int buttonStartColumn = info.extension ? 1 : 0;
    int buttonNumColumns = info.extension ? 1 : numColumns;

    if (classic || modern) {
        if (!bottomRuler)
            bottomRuler = new QWizardRuler(antiFlickerWidget);
        mainLayout->addWidget(bottomRuler, row++, buttonStartColumn, 1, buttonNumColumns);
    }

    if (classic)
        mainLayout->setRowMinimumHeight(row++, deltaVSpacing);

    mainLayout->addLayout(buttonLayout, row++, buttonStartColumn, 1, buttonNumColumns);

    if (info.watermark || info.sideWidget) {
        if (info.extension)
            watermarkEndRow = row;
        mainLayout->addWidget(watermarkLabel, watermarkStartRow, 0,
                              watermarkEndRow - watermarkStartRow, 1);
    }

    mainLayout->setColumnMinimumWidth(0, mac && !info.watermark ? 181 : 0);
    if (mac)
        mainLayout->setColumnMinimumWidth(2, 21);

    if (headerWidget)
        headerWidget->setVisible(info.header);
    if (titleLabel)
        titleLabel->setVisible(info.title);
    if (subTitleLabel)
        subTitleLabel->setVisible(info.subTitle);
    if (bottomRuler)
        bottomRuler->setVisible(classic || modern);
    if (watermarkLabel)
        watermarkLabel->setVisible(info.watermark || info.sideWidget);

    layoutInfo = info;
}